

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbnf.cpp
# Opt level: O0

void __thiscall
icu_63::RuleBasedNumberFormat::setDefaultRuleSet
          (RuleBasedNumberFormat *this,UnicodeString *ruleSetName,UErrorCode *status)

{
  UBool UVar1;
  int iVar2;
  undefined4 extraout_var;
  NFRuleSet *pNVar3;
  NFRuleSet *result;
  UnicodeString local_b8;
  ConstChar16Ptr local_68;
  undefined1 local_60 [8];
  UnicodeString name;
  UErrorCode *status_local;
  UnicodeString *ruleSetName_local;
  RuleBasedNumberFormat *this_local;
  
  name.fUnion._48_8_ = status;
  UVar1 = ::U_SUCCESS(*status);
  if (UVar1 != '\0') {
    UVar1 = UnicodeString::isEmpty(ruleSetName);
    if (UVar1 == '\0') {
      ConstChar16Ptr::ConstChar16Ptr((ConstChar16Ptr *)&result,L"%%");
      UnicodeString::UnicodeString(&local_b8,'\x01',(ConstChar16Ptr *)&result,-1);
      UVar1 = UnicodeString::startsWith(ruleSetName,&local_b8);
      UnicodeString::~UnicodeString(&local_b8);
      ConstChar16Ptr::~ConstChar16Ptr((ConstChar16Ptr *)&result);
      if (UVar1 == '\0') {
        pNVar3 = findRuleSet(this,ruleSetName,(UErrorCode *)name.fUnion._48_8_);
        if (pNVar3 != (NFRuleSet *)0x0) {
          this->defaultRuleSet = pNVar3;
        }
      }
      else {
        *(undefined4 *)name.fUnion._48_8_ = 1;
      }
    }
    else if (this->localizations == (LocalizationInfo *)0x0) {
      initDefaultRuleSet(this);
    }
    else {
      iVar2 = (*this->localizations->_vptr_LocalizationInfo[4])(this->localizations,0);
      ConstChar16Ptr::ConstChar16Ptr(&local_68,(char16_t *)CONCAT44(extraout_var,iVar2));
      UnicodeString::UnicodeString((UnicodeString *)local_60,'\x01',&local_68,-1);
      ConstChar16Ptr::~ConstChar16Ptr(&local_68);
      pNVar3 = findRuleSet(this,(UnicodeString *)local_60,(UErrorCode *)name.fUnion._48_8_);
      this->defaultRuleSet = pNVar3;
      UnicodeString::~UnicodeString((UnicodeString *)local_60);
    }
  }
  return;
}

Assistant:

void 
RuleBasedNumberFormat::setDefaultRuleSet(const UnicodeString& ruleSetName, UErrorCode& status) {
    if (U_SUCCESS(status)) {
        if (ruleSetName.isEmpty()) {
          if (localizations) {
              UnicodeString name(TRUE, localizations->getRuleSetName(0), -1);
              defaultRuleSet = findRuleSet(name, status);
          } else {
            initDefaultRuleSet();
          }
        } else if (ruleSetName.startsWith(UNICODE_STRING_SIMPLE("%%"))) {
            status = U_ILLEGAL_ARGUMENT_ERROR;
        } else {
            NFRuleSet* result = findRuleSet(ruleSetName, status);
            if (result != NULL) {
                defaultRuleSet = result;
            }
        }
    }
}